

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib571.c
# Opt level: O2

size_t rtp_write(void *ptr,size_t size,size_t nmemb,void *stream)

{
  void *__s2;
  undefined1 uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  ulong __n;
  size_t sVar5;
  long lVar6;
  
  uVar1 = *(undefined1 *)((long)ptr + 1);
  uVar2 = *(ushort *)((long)ptr + 2) << 8 | *(ushort *)((long)ptr + 2) >> 8;
  sVar5 = (size_t)(nmemb == 0 || size == 0);
  iVar3 = curlx_uztosi(nmemb * size);
  uVar4 = iVar3 - 4;
  curl_mprintf("RTP: message size %d, channel %d\n",uVar4,uVar1);
  if (uVar4 == uVar2) {
    __n = (ulong)uVar2;
    for (lVar6 = 4; lVar6 - 4U < (ulong)uVar2; lVar6 = lVar6 + 0xc) {
      __s2 = (void *)((long)ptr + lVar6);
      if ((long)__n < 0xd) {
        iVar3 = bcmp("$_1234\n",__s2,__n);
        if (iVar3 != 0) {
          curl_mprintf("RTP PAYLOAD END CORRUPTED (%d), [%s]\n",__n & 0xffffffff,__s2);
          return sVar5;
        }
      }
      else {
        iVar3 = bcmp("$_1234\n",__s2,0xc);
        if (iVar3 != 0) {
          curl_mprintf("RTP PAYLOAD CORRUPTED [%s]\n",__s2);
          return sVar5;
        }
      }
      __n = __n - 0xc;
    }
    rtp_packet_count = rtp_packet_count + 1;
    curl_mfprintf(_stderr,"packet count is %d\n");
    sVar5 = nmemb * size;
  }
  else {
    curl_mprintf("RTP embedded size (%d) does not match the write size (%d).\n",(uint)uVar2,uVar4);
  }
  return sVar5;
}

Assistant:

static size_t rtp_write(void *ptr, size_t size, size_t nmemb, void *stream)
{
  char *data = (char *)ptr;
  int channel = RTP_PKT_CHANNEL(data);
  int message_size;
  int coded_size = RTP_PKT_LENGTH(data);
  size_t failure = (size && nmemb) ? 0 : 1;
  int i;
  (void)stream;

  message_size = curlx_uztosi(size * nmemb) - 4;

  printf("RTP: message size %d, channel %d\n", message_size, channel);
  if(message_size != coded_size) {
    printf("RTP embedded size (%d) does not match the write size (%d).\n",
           coded_size, message_size);
    return failure;
  }

  data += 4;
  for(i = 0; i < message_size; i += RTP_DATA_SIZE) {
    if(message_size - i > RTP_DATA_SIZE) {
      if(memcmp(RTP_DATA, data + i, RTP_DATA_SIZE) != 0) {
        printf("RTP PAYLOAD CORRUPTED [%s]\n", data + i);
        return failure;
      }
    }
    else {
      if(memcmp(RTP_DATA, data + i, message_size - i) != 0) {
        printf("RTP PAYLOAD END CORRUPTED (%d), [%s]\n",
               message_size - i, data + i);
        return failure;
      }
    }
  }

  rtp_packet_count++;
  fprintf(stderr, "packet count is %d\n", rtp_packet_count);

  return size * nmemb;
}